

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O0

int get_test_set(int *test_set,int limit,char *test,test_list_t *tests)

{
  bool bVar1;
  int iVar2;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  char *name;
  char *vp;
  int idx;
  int end;
  int start;
  int local_50;
  char *local_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int iVar4;
  int local_4;
  
  local_50 = 0;
  if (in_RDX == (char *)0x0) {
    for (; local_4 = in_ESI, local_50 < in_ESI; local_50 = local_50 + 1) {
      *(int *)(in_RDI + (long)local_50 * 4) = local_50;
    }
  }
  else {
    if ((*in_RDX < '0') || ('9' < *in_RDX)) {
      for (iVar4 = 0; iVar4 < in_ESI; iVar4 = iVar4 + 1) {
        iVar2 = test_filter((char *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                            (char *)CONCAT44(local_50,in_stack_ffffffffffffffc8));
        iVar3 = local_50;
        if (iVar2 != 0) {
          iVar3 = local_50 + 1;
          *(int *)(in_RDI + (long)local_50 * 4) = iVar4;
        }
        local_50 = iVar3;
      }
    }
    else {
      iVar4 = 0;
      local_40 = in_RDX;
      while( true ) {
        bVar1 = false;
        if ('/' < *local_40) {
          bVar1 = *local_40 < ':';
        }
        if (!bVar1) break;
        iVar4 = *local_40 + -0x30 + iVar4 * 10;
        local_40 = local_40 + 1;
      }
      iVar3 = iVar4;
      if (*local_40 != '\0') {
        if (*local_40 != '-') {
          return -1;
        }
        local_40 = local_40 + 1;
        if (*local_40 == '\0') {
          iVar3 = in_ESI + -1;
        }
        else {
          iVar3 = 0;
          while( true ) {
            bVar1 = false;
            if ('/' < *local_40) {
              bVar1 = *local_40 < ':';
            }
            if (!bVar1) break;
            iVar3 = *local_40 + -0x30 + iVar3 * 10;
            local_40 = local_40 + 1;
          }
        }
      }
      if (((iVar4 < 0) || (in_ESI <= iVar3)) || (iVar3 < iVar4)) {
        return -1;
      }
      for (; iVar4 <= iVar3; iVar4 = iVar4 + 1) {
        *(int *)(in_RDI + (long)local_50 * 4) = iVar4;
        local_50 = local_50 + 1;
      }
    }
    if (local_50 == 0) {
      local_50 = -1;
    }
    local_4 = local_50;
  }
  return local_4;
}

Assistant:

int get_test_set(int *test_set, int limit, const char *test,
	struct test_list_t *tests)
{
	int start, end;
	int idx = 0;

	if (test == NULL) {
		/* Default: Run all tests. */
		for (;idx < limit; idx++)
			test_set[idx] = idx;
		return (limit);
	}
	if (*test >= '0' && *test <= '9') {
		const char *vp = test;
		start = 0;
		while (*vp >= '0' && *vp <= '9') {
			start *= 10;
			start += *vp - '0';
			++vp;
		}
		if (*vp == '\0') {
			end = start;
		} else if (*vp == '-') {
			++vp;
			if (*vp == '\0') {
				end = limit - 1;
			} else {
				end = 0;
				while (*vp >= '0' && *vp <= '9') {
					end *= 10;
					end += *vp - '0';
					++vp;
				}
			}
		} else
			return (-1);
		if (start < 0 || end >= limit || start > end)
			return (-1);
		while (start <= end)
			test_set[idx++] = start++;
	} else {
		for (start = 0; start < limit; ++start) {
			const char *name = tests[start].name;
			if (test_filter(test, name))
				test_set[idx++] = start;
		}
	}
	return ((idx == 0)?-1:idx);
}